

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_18f9de::CBBTest_FlushASN1SetOf_Test::TestBody(CBBTest_FlushASN1SetOf_Test *this)

{
  void *pvVar1;
  anon_union_32_2_4f6aaa2e_for_u *paVar2;
  undefined1 auVar3 [8];
  int iVar4;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar5;
  uint8_t *puVar6;
  long lVar7;
  pointer *__ptr;
  long lVar8;
  char *pcVar9;
  char *in_R9;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  initializer_list<unsigned_char> __l_04;
  initializer_list<unsigned_char> __l_05;
  initializer_list<unsigned_char> __l_06;
  initializer_list<unsigned_char> __l_07;
  AssertionResult gtest_ar__6;
  ScopedTrace gtest_trace_1481;
  AssertionResult gtest_ar_;
  ScopedTrace gtest_trace_1455;
  AssertionResult gtest_ar;
  vector<unsigned_char,_std::allocator<unsigned_char>_> kInvalidInputs [3];
  CBB child;
  AssertHelper local_1f8;
  undefined1 local_1f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  allocator_type local_1d9;
  undefined1 local_1d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  AssertHelper local_1b8;
  undefined1 local_1b0 [16];
  anon_union_32_2_4f6aaa2e_for_u local_1a0;
  undefined8 uStack_180;
  undefined1 local_178 [48];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  CBB local_128;
  long local_f8 [6];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  
  local_f8[4] = 0;
  local_f8[5] = 0;
  local_f8[2] = 0;
  local_f8[3] = 0;
  local_f8[0] = 0;
  local_f8[1] = 0;
  local_1f0._0_2_ = 0x30;
  __l._M_len = 2;
  __l._M_array = local_1f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_c8,__l,(allocator_type *)&local_1b8);
  local_1f8.data_._0_2_ = 0x30;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_1f8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_b0,__l_00,&local_1d9);
  local_1b0[0] = (internal)0x30;
  local_1b0[1] = 0;
  local_1b0._2_2_ = 0x30;
  __l_01._M_len = 4;
  __l_01._M_array = local_1b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_98,__l_01,(allocator_type *)((long)&uStack_180 + 7));
  local_1d8._0_4_ = 0x300030;
  __l_02._M_len = 4;
  __l_02._M_array = local_1d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_80,__l_02,(allocator_type *)((long)&uStack_180 + 6));
  local_178._16_6_ = 0x330003000;
  local_178._22_8_ = 0x1010001300100;
  local_178._0_8_ = (CBB *)0x1003000000230;
  local_178._8_6_ = 0x33000000230;
  local_178._14_2_ = 0;
  __l_03._M_len = 0x1e;
  __l_03._M_array = (iterator)local_178;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_68,__l_03,(allocator_type *)((long)&uStack_180 + 5));
  local_128.u._0_6_ = 0x33000000230;
  local_128.u._6_8_ = 0x100000330000000;
  local_128.child = (CBB *)0x3000300001010001;
  local_128.is_child = '\0';
  local_128._9_5_ = 0x230000130;
  local_128._14_2_ = 0;
  __l_04._M_len = 0x1e;
  __l_04._M_array = (iterator)&local_128;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_50,__l_04,(allocator_type *)((long)&uStack_180 + 4));
  lVar8 = 0x20;
  do {
    local_178._0_8_ = *(long *)((long)local_f8 + lVar8 + -0x20);
    lVar7 = *(long *)((long)local_f8 + lVar8 + -0x18) - local_178._0_8_;
    local_178._8_6_ = (undefined6)lVar7;
    local_178._14_2_ = (undefined2)((ulong)lVar7 >> 0x30);
    testing::ScopedTrace::ScopedTrace<Bytes>
              ((ScopedTrace *)&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x5af,(Bytes *)local_178);
    CBB_zero((CBB *)local_178);
    iVar4 = CBB_init((CBB *)local_178,0);
    local_1d8[0] = iVar4 != 0;
    local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)local_1f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1b0,(internal *)local_1d8,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x5b3,(char *)CONCAT44(local_1b0._4_4_,
                                         CONCAT22(local_1b0._2_2_,
                                                  CONCAT11(local_1b0[1],local_1b0[0]))));
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)local_1f0);
LAB_0022703e:
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      paVar2 = (anon_union_32_2_4f6aaa2e_for_u *)
               CONCAT44(local_1b0._4_4_,
                        CONCAT22(local_1b0._2_2_,CONCAT11(local_1b0[1],local_1b0[0])));
      if (paVar2 != &local_1a0) {
        operator_delete(paVar2,(ulong)(local_1a0.base.buf + 1));
      }
      if (local_1f0 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1f0 + 8))();
      }
      if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1d0,local_1d0);
      }
      CBB_cleanup((CBB *)local_178);
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_1b8);
      goto LAB_0022709c;
    }
    iVar4 = CBB_add_asn1((CBB *)local_178,&local_128,0x20000011);
    local_1d8[0] = iVar4 != 0;
    local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)local_1f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1b0,(internal *)local_1d8,
                 (AssertionResult *)"CBB_add_asn1(cbb.get(), &child, (0x11u | (0x20u << 24)))",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x5b4,(char *)CONCAT44(local_1b0._4_4_,
                                         CONCAT22(local_1b0._2_2_,
                                                  CONCAT11(local_1b0[1],local_1b0[0]))));
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)local_1f0);
      goto LAB_0022703e;
    }
    puVar6 = *(uint8_t **)((long)local_f8 + lVar8 + -0x20);
    iVar4 = CBB_add_bytes(&local_128,puVar6,*(long *)((long)local_f8 + lVar8 + -0x18) - (long)puVar6
                         );
    local_1d8[0] = iVar4 != 0;
    local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)local_1f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1b0,(internal *)local_1d8,
                 (AssertionResult *)"CBB_add_bytes(&child, t.in.data(), t.in.size())","false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x5b5,(char *)CONCAT44(local_1b0._4_4_,
                                         CONCAT22(local_1b0._2_2_,
                                                  CONCAT11(local_1b0[1],local_1b0[0]))));
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)local_1f0);
      goto LAB_0022703e;
    }
    iVar4 = CBB_flush_asn1_set_of(&local_128);
    local_1d8[0] = iVar4 != 0;
    local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)local_1f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1b0,(internal *)local_1d8,
                 (AssertionResult *)"CBB_flush_asn1_set_of(&child)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x5b6,(char *)CONCAT44(local_1b0._4_4_,
                                         CONCAT22(local_1b0._2_2_,
                                                  CONCAT11(local_1b0[1],local_1b0[0]))));
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)local_1f0);
      goto LAB_0022703e;
    }
    local_1d8 = *(undefined1 (*) [8])
                 &((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    *)((long)local_f8 + lVar8 + -8))->
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (*(long *)((long)local_f8 + lVar8) - (long)local_1d8);
    uVar5._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )CBB_data(&local_128);
    local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CBB_len(&local_128);
    local_1f0 = (undefined1  [8])
                uVar5._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_1b0,"Bytes(t.out)","Bytes(CBB_data(&child), CBB_len(&child))",
               (Bytes *)local_1d8,(Bytes *)local_1f0);
    if (local_1b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1d8);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)local_1b0._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x5b7,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1f0,(Message *)local_1d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f0);
      if (local_1d8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1d8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1b0 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1b0._8_8_);
    }
    iVar4 = CBB_flush_asn1_set_of(&local_128);
    local_1d8[0] = iVar4 != 0;
    local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)local_1f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1b0,(internal *)local_1d8,
                 (AssertionResult *)"CBB_flush_asn1_set_of(&child)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x5ba,(char *)CONCAT44(local_1b0._4_4_,
                                         CONCAT22(local_1b0._2_2_,
                                                  CONCAT11(local_1b0[1],local_1b0[0]))));
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)local_1f0);
      goto LAB_0022703e;
    }
    local_1d8 = *(undefined1 (*) [8])
                 &((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    *)((long)local_f8 + lVar8 + -8))->
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (*(long *)((long)local_f8 + lVar8) - (long)local_1d8);
    uVar5._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )CBB_data(&local_128);
    local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CBB_len(&local_128);
    local_1f0 = (undefined1  [8])
                uVar5._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_1b0,"Bytes(t.out)","Bytes(CBB_data(&child), CBB_len(&child))",
               (Bytes *)local_1d8,(Bytes *)local_1f0);
    if (local_1b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1d8);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)local_1b0._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x5bb,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1f0,(Message *)local_1d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f0);
      if (local_1d8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1d8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1b0 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1b0._8_8_);
    }
    iVar4 = CBB_flush((CBB *)local_178);
    auVar3 = local_1d8;
    local_1d8[0] = iVar4 != 0;
    local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)local_1f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1b0,(internal *)local_1d8,(AssertionResult *)"CBB_flush(cbb.get())"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x5be,(char *)CONCAT44(local_1b0._4_4_,
                                         CONCAT22(local_1b0._2_2_,
                                                  CONCAT11(local_1b0[1],local_1b0[0]))));
      testing::internal::AssertHelper::operator=(&local_1f8,(Message *)local_1f0);
      goto LAB_0022703e;
    }
    local_1d8._4_4_ = auVar3._4_4_;
    local_1d8._0_4_ = 0x31;
    puVar6 = CBB_data((CBB *)local_178);
    testing::internal::CmpHelperEQ<int,unsigned_char>
              ((internal *)local_1b0,"0x31","CBB_data(cbb.get())[0]",(int *)local_1d8,puVar6);
    if (local_1b0[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1d8);
      pcVar9 = "";
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = ((_Alloc_hider *)local_1b0._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_1f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x5bf,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_1f0,(Message *)local_1d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1f0);
      if (local_1d8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1d8 + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_1b0 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_1b0._8_8_);
    }
    CBB_cleanup((CBB *)local_178);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_1b8);
    lVar8 = lVar8 + 0x30;
  } while (lVar8 != 0xe0);
  local_1d8[0] = 0x30;
  __l_05._M_len = 1;
  __l_05._M_array = local_1d8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178,__l_05,
             (allocator_type *)local_1f0);
  local_1b0[0] = (internal)0x30;
  local_1b0[1] = 1;
  __l_06._M_len = 2;
  __l_06._M_array = local_1b0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&((CBB *)local_178)->u + 8),__l_06,(allocator_type *)&local_1f8);
  local_128.child = (CBB *)CONCAT26(local_128.child._6_2_,0x13000300030);
  __l_07._M_len = 6;
  __l_07._M_array = (iterator)&local_128;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_148,__l_07,(allocator_type *)&local_1b8);
  lVar8 = 8;
  do {
    local_128.child = *(CBB **)((long)&uStack_180 + lVar8);
    lVar7 = *(long *)((long)&((CBB *)local_178)->child + lVar8) - (long)local_128.child;
    local_128._8_6_ = SUB86(lVar7,0);
    local_128._14_2_ = SUB82((ulong)lVar7 >> 0x30,0);
    testing::ScopedTrace::ScopedTrace<Bytes>
              ((ScopedTrace *)&local_1d9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x5c9,(Bytes *)&local_128);
    CBB_zero(&local_128);
    iVar4 = CBB_init(&local_128,0);
    local_1f0[0] = iVar4 != 0;
    local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_1f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1d8,(internal *)local_1f0,
                 (AssertionResult *)"CBB_init(cbb.get(), 0)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x5cd,(char *)local_1d8);
      testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1f8);
LAB_00227205:
      testing::internal::AssertHelper::~AssertHelper(&local_1b8);
      if (local_1d8 != (undefined1  [8])&local_1c8) {
        operator_delete((void *)local_1d8,local_1c8._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT62(local_1f8.data_._2_6_,local_1f8.data_._0_2_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT62(local_1f8.data_._2_6_,local_1f8.data_._0_2_) + 8))();
      }
      if (local_1e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1e8,local_1e8);
      }
      CBB_cleanup(&local_128);
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_1d9);
      break;
    }
    iVar4 = CBB_add_asn1(&local_128,(CBB *)local_1b0,0x20000011);
    local_1f0[0] = iVar4 != 0;
    local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_1f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1d8,(internal *)local_1f0,
                 (AssertionResult *)"CBB_add_asn1(cbb.get(), &child, (0x11u | (0x20u << 24)))",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x5ce,(char *)local_1d8);
      testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1f8);
      goto LAB_00227205;
    }
    iVar4 = CBB_add_bytes((CBB *)local_1b0,*(uint8_t **)((long)&uStack_180 + lVar8),
                          *(long *)((long)&((CBB *)local_178)->child + lVar8) -
                          (long)*(uint8_t **)((long)&uStack_180 + lVar8));
    local_1f0[0] = iVar4 != 0;
    local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&local_1f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1d8,(internal *)local_1f0,
                 (AssertionResult *)"CBB_add_bytes(&child, t.data(), t.size())","false","true",in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x5cf,(char *)local_1d8);
      testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1f8);
      goto LAB_00227205;
    }
    iVar4 = CBB_flush_asn1_set_of((CBB *)local_1b0);
    local_1f0[0] = iVar4 == 0;
    local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar4 != 0) {
      testing::Message::Message((Message *)&local_1f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1d8,(internal *)local_1f0,
                 (AssertionResult *)"CBB_flush_asn1_set_of(&child)","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x5d0,(char *)local_1d8);
      testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1f8);
      testing::internal::AssertHelper::~AssertHelper(&local_1b8);
      if (local_1d8 != (undefined1  [8])&local_1c8) {
        operator_delete((void *)local_1d8,local_1c8._M_allocated_capacity + 1);
      }
      if ((long *)CONCAT62(local_1f8.data_._2_6_,local_1f8.data_._0_2_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT62(local_1f8.data_._2_6_,local_1f8.data_._0_2_) + 8))();
      }
    }
    if (local_1e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e8,local_1e8);
    }
    CBB_cleanup(&local_128);
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_1d9);
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x50);
  lVar8 = 0x48;
  do {
    pvVar1 = *(void **)((long)&local_1a0 + lVar8 + 0x10);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&uStack_180 + lVar8) - (long)pvVar1);
    }
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != 0);
LAB_0022709c:
  lVar8 = 0xc0;
  do {
    pvVar1 = *(void **)((long)local_f8 + lVar8 + -0x18);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_f8 + lVar8 + -8) - (long)pvVar1);
    }
    pvVar1 = *(void **)((long)&local_128.child + lVar8);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_f8 + lVar8 + -0x20) - (long)pvVar1);
    }
    lVar8 = lVar8 + -0x30;
  } while (lVar8 != 0);
  return;
}

Assistant:

TEST(CBBTest, FlushASN1SetOf) {
  const struct {
    std::vector<uint8_t> in, out;
  } kValidInputs[] = {
      // No elements.
      {{}, {}},
      // One element.
      {{0x30, 0x00}, {0x30, 0x00}},
      // Two identical elements.
      {{0x30, 0x00, 0x30, 0x00}, {0x30, 0x00, 0x30, 0x00}},
      // clang-format off
    {{0x30, 0x02, 0x00, 0x00,
      0x30, 0x00,
      0x01, 0x00,
      0x30, 0x02, 0x00, 0x00,
      0x30, 0x03, 0x00, 0x00, 0x00,
      0x30, 0x00,
      0x30, 0x03, 0x00, 0x00, 0x01,
      0x30, 0x01, 0x00,
      0x01, 0x01, 0x00},
     {0x01, 0x00,
      0x01, 0x01, 0x00,
      0x30, 0x00,
      0x30, 0x00,
      0x30, 0x01, 0x00,
      0x30, 0x02, 0x00, 0x00,
      0x30, 0x02, 0x00, 0x00,
      0x30, 0x03, 0x00, 0x00, 0x00,
      0x30, 0x03, 0x00, 0x00, 0x01}},
      // clang-format on
  };

  for (const auto &t : kValidInputs) {
    SCOPED_TRACE(Bytes(t.in));

    bssl::ScopedCBB cbb;
    CBB child;
    ASSERT_TRUE(CBB_init(cbb.get(), 0));
    ASSERT_TRUE(CBB_add_asn1(cbb.get(), &child, CBS_ASN1_SET));
    ASSERT_TRUE(CBB_add_bytes(&child, t.in.data(), t.in.size()));
    ASSERT_TRUE(CBB_flush_asn1_set_of(&child));
    EXPECT_EQ(Bytes(t.out), Bytes(CBB_data(&child), CBB_len(&child)));

    // Running it again should be idempotent.
    ASSERT_TRUE(CBB_flush_asn1_set_of(&child));
    EXPECT_EQ(Bytes(t.out), Bytes(CBB_data(&child), CBB_len(&child)));

    // The ASN.1 header remain intact.
    ASSERT_TRUE(CBB_flush(cbb.get()));
    EXPECT_EQ(0x31, CBB_data(cbb.get())[0]);
  }

  const std::vector<uint8_t> kInvalidInputs[] = {
      {0x30},
      {0x30, 0x01},
      {0x30, 0x00, 0x30, 0x00, 0x30, 0x01},
  };

  for (const auto &t : kInvalidInputs) {
    SCOPED_TRACE(Bytes(t));

    bssl::ScopedCBB cbb;
    CBB child;
    ASSERT_TRUE(CBB_init(cbb.get(), 0));
    ASSERT_TRUE(CBB_add_asn1(cbb.get(), &child, CBS_ASN1_SET));
    ASSERT_TRUE(CBB_add_bytes(&child, t.data(), t.size()));
    EXPECT_FALSE(CBB_flush_asn1_set_of(&child));
  }
}